

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

uint * getRevealedMerkleNodes
                 (tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,size_t *outputSize)

{
  ulong *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  void *__ptr;
  size_t sVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  
  if (missingLeaves != (uint16_t *)0x0 || missingLeavesSize == 0) {
    uVar8 = tree->numNodes;
    uVar12 = tree->numLeaves;
    __ptr = calloc((ulong)uVar8 + 0x3f >> 6,8);
    if (__ptr != (void *)0x0) {
      iVar10 = uVar8 - uVar12;
      if (missingLeavesSize != 0) {
        sVar4 = 0;
        do {
          uVar7 = (uint)missingLeaves[sVar4] + iVar10;
          puVar1 = (ulong *)((long)__ptr + (ulong)(uVar7 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((ulong)uVar7 & 0x3f);
          sVar4 = sVar4 + 1;
        } while (missingLeavesSize != sVar4);
      }
      uVar7 = uVar8 >> 1;
      if (uVar7 - 1 != 0) {
        uVar6 = (ulong)(uVar7 - 1);
        uVar9 = uVar6 * 2;
        uVar11 = uVar7 * 2;
        uVar7 = uVar7 << 2;
        do {
          if ((uVar6 < uVar8) &&
             ((tree->haveNodeExists[uVar9 >> 6 & 0x3ffffff] >> (ulong)((uint)uVar9 & 0x3e) & 1) != 0
             )) {
            if ((uVar11 < uVar8) && ((tree->haveNodeExists[uVar7 >> 6] >> (uVar7 & 0x3c) & 1) != 0))
            {
              if ((*(ulong *)((long)__ptr + (ulong)(uVar11 - 1 >> 6) * 8) >>
                   ((ulong)(uVar11 - 1) & 0x3f) & 1) == 0) goto LAB_0012219f;
              uVar13 = *(ulong *)((long)__ptr + (ulong)(uVar11 >> 6) * 8) >> (ulong)(uVar11 & 0x3e);
            }
            else {
              uVar13 = *(ulong *)((long)__ptr + (ulong)(uVar11 - 1 >> 6) * 8) >>
                       ((ulong)(uVar11 - 1) & 0x3f);
            }
            if ((uVar13 & 1) != 0) {
              puVar1 = (ulong *)((long)__ptr + (uVar6 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << (uVar6 & 0x3f);
            }
          }
LAB_0012219f:
          uVar6 = uVar6 - 1;
          uVar9 = uVar9 - 2;
          uVar11 = uVar11 - 2;
          uVar7 = uVar7 - 4;
        } while ((int)uVar6 != 0);
      }
      puVar5 = (uint *)malloc((ulong)uVar12 << 2);
      if (puVar5 != (uint *)0x0) {
        sVar4 = 0;
        if (missingLeavesSize == 0) {
LAB_00122272:
          free(__ptr);
          *outputSize = sVar4;
          return puVar5;
        }
        uVar9 = 0;
LAB_001221db:
        uVar8 = (uint)missingLeaves[uVar9] + iVar10;
        do {
          uVar12 = (uVar8 + 1 >> 1) - 1;
          if ((*(ulong *)((long)__ptr + (ulong)(uVar12 >> 6) * 8) >> ((ulong)uVar12 & 0x3f) & 1) ==
              0) {
            uVar6 = sVar4 & 0xfffffffc;
            if (uVar6 == 0) {
              uVar6 = 0;
              goto LAB_0012223a;
            }
            auVar15 = vpbroadcastd_avx512vl();
            uVar13 = 0;
            goto LAB_0012221f;
          }
          uVar8 = uVar12;
        } while (uVar12 != 0);
        goto LAB_00122265;
      }
      free(__ptr);
    }
  }
  return (uint *)0x0;
  while (uVar13 = uVar13 + 4, uVar13 < uVar6) {
LAB_0012221f:
    auVar3 = vpcmpeqd_avx(auVar15,*(undefined1 (*) [16])(puVar5 + uVar13));
    if ((((auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar3[0xf] < '\0')
    goto LAB_00122265;
  }
LAB_0012223a:
  if (uVar6 < sVar4) {
    do {
      puVar2 = puVar5 + uVar6;
      if (*puVar2 == uVar8) break;
      bVar14 = sVar4 - 1 != uVar6;
      uVar6 = uVar6 + 1;
    } while (bVar14);
    if (*puVar2 == uVar8) goto LAB_00122265;
  }
  puVar5[sVar4] = uVar8;
  sVar4 = (size_t)((int)sVar4 + 1);
LAB_00122265:
  uVar9 = (ulong)((int)uVar9 + 1);
  if (missingLeavesSize <= uVar9) goto LAB_00122272;
  goto LAB_001221db;
}

Assistant:

static unsigned int* getRevealedMerkleNodes(const tree_t* tree, uint16_t* missingLeaves,
                                            size_t missingLeavesSize, size_t* outputSize) {
  if (!missingLeaves && missingLeavesSize) {
    return NULL;
  }

  const unsigned int firstLeaf = tree->numNodes - tree->numLeaves;
  bitset_word_t* missingNodes =
      calloc((tree->numNodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if (!missingNodes) {
    return NULL;
  }

  /* Mark leaves that are missing */
  for (size_t i = 0; i < missingLeavesSize; i++) {
    set_bit(missingNodes, firstLeaf + missingLeaves[i]);
  }

  /* For the nonleaf nodes, if both leaves are missing, mark it as missing too */
  for (unsigned int i = getParent(tree->numNodes - 1); i > 0; i--) {
    if (!exists(tree, i)) {
      continue;
    }
    if (exists(tree, 2 * i + 2)) {
      if (get_bit(missingNodes, 2 * i + 1) && get_bit(missingNodes, 2 * i + 2)) {
        set_bit(missingNodes, i);
      }
    } else {
      if (get_bit(missingNodes, 2 * i + 1)) {
        set_bit(missingNodes, i);
      }
    }
  }

  /* For each missing leaf node, add the highest missing node on the path
   * back to the root to the set to be revealed */
  unsigned int* revealed = malloc(tree->numLeaves * sizeof(unsigned int));
  if (!revealed) {
    free(missingNodes);
    return NULL;
  }

  unsigned int pos = 0;
  for (unsigned int i = 0; i < missingLeavesSize; i++) {
    /* input is leaf indexes, translate to nodes */
    unsigned int node = missingLeaves[i] + firstLeaf;
    do {
      if (!get_bit(missingNodes, getParent(node))) {
        if (!contains(revealed, pos, node)) {
          revealed[pos] = node;
          pos++;
        }
        break;
      }
    } while ((node = getParent(node)) != 0);
  }

  free(missingNodes);
  *outputSize = pos;
  return revealed;
}